

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

ConstraintDB * __thiscall Clasp::Solver::allocUndo(Solver *this,Constraint *c)

{
  pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *this_00;
  pointer ppCVar1;
  Constraint *local_18;
  
  this_00 = this->undoHead_;
  local_18 = c;
  if (this_00 == (pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)0x0) {
    this_00 = (pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
              operator_new(0x10);
    (this_00->ebo_).buf = (pointer)0x0;
    (this_00->ebo_).size = 0;
    (this_00->ebo_).cap = 1;
    ppCVar1 = (pointer)operator_new(8);
    (this_00->ebo_).buf = ppCVar1;
    *ppCVar1 = c;
    (this_00->ebo_).size = 1;
  }
  else {
    this->undoHead_ = (ConstraintDB *)*(this_00->ebo_).buf;
    (this_00->ebo_).size = 0;
    bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::push_back
              (this_00,&local_18);
  }
  return this_00;
}

Assistant:

Solver::ConstraintDB* Solver::allocUndo(Constraint* c) {
	if (undoHead_ == 0) {
		return new ConstraintDB(1, c);
	}
	assert(undoHead_->size() == 1);
	ConstraintDB* r = undoHead_;
	undoHead_ = (ConstraintDB*)undoHead_->front();
	r->clear();
	r->push_back(c);
	return r;
}